

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O0

type * __thiscall
jsoncons::basic_staj_event<char>::get_<std::__cxx11::string,std::allocator<char>,char>
          (void *param_1,basic_staj_event<char> *param_2,undefined8 param_3,undefined8 param_4)

{
  value_converter<jsoncons::null_type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  converter_7;
  value_converter<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  converter_6;
  value_converter<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  converter_5;
  value_converter<jsoncons::half_arg_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  converter_4;
  value_converter<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  converter_3;
  value_converter<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  converter_2;
  value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  converter_1;
  value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  converter;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff18;
  error_code *in_stack_ffffffffffffff20;
  error_code *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff3c;
  unsigned_long in_stack_ffffffffffffff40;
  undefined1 *value;
  error_code *in_stack_ffffffffffffff48;
  value_converter<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *this;
  error_code *in_stack_ffffffffffffff50;
  undefined2 uVar1;
  value_converter<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *in_stack_ffffffffffffff58;
  semantic_tag sVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff60;
  byte_string_view *value_00;
  error_code *in_stack_ffffffffffffff68;
  byte_string_view *this_00;
  double in_stack_ffffffffffffff70;
  value_converter<jsoncons::half_arg_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *in_stack_ffffffffffffff78;
  undefined1 local_5a [2];
  byte_string_view local_58;
  undefined1 local_45 [37];
  undefined8 local_20;
  undefined8 local_18;
  basic_staj_event<char> *local_10;
  void *local_8;
  
  sVar2 = (semantic_tag)((uint)in_stack_ffffffffffffff3c >> 0x18);
  local_20 = param_4;
  local_18 = param_3;
  local_10 = param_2;
  local_8 = param_1;
  switch(param_2->event_type_) {
  case key:
  case string_value:
    value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::value_converter((value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                       *)in_stack_ffffffffffffff30);
    sVar2 = (semantic_tag)((ulong)in_stack_ffffffffffffff58 >> 0x38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)(local_45 + 0xd),
               (param_2->value_).string_data_,param_2->length_);
    tag(param_2);
    value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::convert((value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,sVar2,in_stack_ffffffffffffff50
             );
    value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::~value_converter((value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)0x2224e3);
    break;
  case byte_string_value:
    value_00 = (byte_string_view *)local_45;
    value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::value_converter((value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                       *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    sVar2 = (semantic_tag)((ulong)in_stack_ffffffffffffff58 >> 0x38);
    this_00 = &local_58;
    byte_string_view::byte_string_view(this_00,(param_2->value_).byte_string_data_,param_2->length_)
    ;
    tag(param_2);
    value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::convert<char>((value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                     *)this_00,value_00,sVar2,in_stack_ffffffffffffff50);
    value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::~value_converter((value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)0x22257d);
    break;
  case null_value:
    value_converter<jsoncons::null_type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::value_converter((value_converter<jsoncons::null_type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                       *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    sVar2 = (semantic_tag)((ulong)in_stack_ffffffffffffff50 >> 0x38);
    tag(param_2);
    value_converter<jsoncons::null_type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::convert((value_converter<jsoncons::null_type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               *)in_stack_ffffffffffffff58,sVar2,in_stack_ffffffffffffff48);
    value_converter<jsoncons::null_type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::~value_converter((value_converter<jsoncons::null_type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)0x222875);
    break;
  case bool_value:
    value_converter<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::value_converter((value_converter<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                       *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    uVar1 = (undefined2)((ulong)in_stack_ffffffffffffff50 >> 0x30);
    tag(param_2);
    value_converter<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::convert(in_stack_ffffffffffffff58,SUB21((ushort)uVar1 >> 8,0),(semantic_tag)uVar1,
              in_stack_ffffffffffffff48);
    value_converter<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::~value_converter((value_converter<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)0x222804);
    break;
  case int64_value:
    value = local_5a;
    value_converter<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::value_converter((value_converter<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                       *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    this = (value_converter<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            *)(param_2->value_).string_data_;
    tag(param_2);
    value_converter<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::convert(this,(long)value,sVar2,in_stack_ffffffffffffff30);
    value_converter<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::~value_converter((value_converter<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)0x22267f);
    break;
  case uint64_value:
    value_converter<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::value_converter((value_converter<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                       *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    tag(param_2);
    value_converter<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::convert((value_converter<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,sVar2,in_stack_ffffffffffffff30
             );
    value_converter<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::~value_converter((value_converter<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)0x2225fe);
    break;
  default:
    std::error_code::operator=
              (in_stack_ffffffffffffff20,(conv_errc)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    std::__cxx11::string::string((string *)param_1);
    break;
  case half_value:
    value_converter<jsoncons::half_arg_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::value_converter((value_converter<jsoncons::half_arg_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                       *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    tag(param_2);
    value_converter<jsoncons::half_arg_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::convert(in_stack_ffffffffffffff78,(uint16_t)((ulong)in_stack_ffffffffffffff70 >> 0x30),
              (semantic_tag)((ulong)in_stack_ffffffffffffff70 >> 0x28),in_stack_ffffffffffffff68);
    value_converter<jsoncons::half_arg_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::~value_converter((value_converter<jsoncons::half_arg_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)0x2226fe);
    break;
  case double_value:
    value_converter<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::value_converter((value_converter<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                       *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    sVar2 = (semantic_tag)((ulong)in_stack_ffffffffffffff68 >> 0x38);
    tag(param_2);
    value_converter<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::convert((value_converter<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,sVar2,
              (error_code *)in_stack_ffffffffffffff60);
    value_converter<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::~value_converter((value_converter<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)0x222782);
  }
  return (type *)param_1;
}

Assistant:

typename std::enable_if<ext_traits::is_string<T>::value && std::is_same<typename T::value_type, CharT_>::value, T>::type
    get_(Allocator,std::error_code& ec) const
    {
        switch (event_type_)
        {
            case staj_event_type::key:
            case staj_event_type::string_value:
            {
                value_converter<jsoncons::basic_string_view<CharT>,T> converter;
                return converter.convert(jsoncons::basic_string_view<CharT>(value_.string_data_, length_), tag(), ec);
            }
            case staj_event_type::byte_string_value:
            {
                value_converter<jsoncons::byte_string_view,T> converter;
                return converter.convert(byte_string_view(value_.byte_string_data_,length_),tag(),ec);
            }
            case staj_event_type::uint64_value:
            {
                value_converter<uint64_t,T> converter;
                return converter.convert(value_.uint64_value_, tag(), ec);
            }
            case staj_event_type::int64_value:
            {
                value_converter<int64_t,T> converter;
                return converter.convert(value_.int64_value_, tag(), ec);
            }
            case staj_event_type::half_value:
            {
                value_converter<half_arg_t,T> converter;
                return converter.convert(value_.half_value_, tag(), ec);
            }
            case staj_event_type::double_value:
            {
                value_converter<double,T> converter;
                return converter.convert(value_.double_value_, tag(), ec);
            }
            case staj_event_type::bool_value:
            {
                value_converter<bool,T> converter;
                return converter.convert(value_.bool_value_,tag(),ec);
            }
            case staj_event_type::null_value:
            {
                value_converter<null_type,T> converter;
                return converter.convert(tag(), ec);
            }
            default:
            {
                ec = conv_errc::not_string;
                return T{};
            }
        }
    }